

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5292d::FileSystemRootNode::set_executable_flag
          (FileSystemRootNode *this,string *filename)

{
  int iVar1;
  char *__file;
  ostream *poVar2;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *filename_local;
  FileSystemRootNode *this_local;
  
  local_20 = filename;
  filename_local = (string *)this;
  GEO::geo_argused<std::__cxx11::string>(filename);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = chmod(__file,0x1ed);
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"FileSyst",&local_41);
    poVar2 = GEO::Logger::err((string *)local_40);
    poVar2 = std::operator<<(poVar2,"Could not change file permissions for:");
    poVar2 = std::operator<<(poVar2,(string *)local_20);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return iVar1 == 0;
}

Assistant:

bool set_executable_flag(const std::string& filename) override {
            geo_argused(filename);
            if(::chmod(filename.c_str(), 0755) != 0) {
                Logger::err("FileSyst")
                    << "Could not change file permissions for:"
                    << filename << std::endl;
		return false;
            }
	    return true;
        }